

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O0

void printKVDataJSON(ktx_uint8_t *pKvd,ktx_uint32_t kvdLen,ktx_uint32_t base_indent,
                    ktx_uint32_t indent_width,_Bool minified)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  _Bool _Var4;
  ktx_error_code_e kVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  byte in_R8B;
  char *pcVar9;
  ktx_uint32_t i;
  ktx_uint32_t number;
  ktx_uint8_t faces;
  ktx_uint32_t loopCount;
  ktx_uint32_t timescale;
  ktx_uint32_t duration;
  ktx_uint32_t glType;
  ktx_uint32_t glFormat;
  ktx_uint32_t glInternalformat;
  ktx_uint32_t valueLen;
  ktx_uint32_t keyLen;
  char *value;
  char *key;
  _Bool firstPrint;
  ktxHashListEntry *entry;
  int entryIndex;
  ktxHashList kvDataHead;
  ktx_error_code_e result;
  char *nl;
  char *space;
  char *in_stack_ffffffffffffff68;
  uint local_8c;
  uint in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  uint local_68;
  uint local_64;
  uint *local_60;
  char *local_58;
  byte local_49;
  void *in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffc4;
  int iVar10;
  ktxHashListEntry *This;
  
  pcVar7 = " ";
  if ((in_R8B & 1) != 0) {
    pcVar7 = "";
  }
  pcVar8 = "\n";
  if ((in_R8B & 1) != 0) {
    pcVar8 = "";
  }
  This = (ktxHashListEntry *)0x0;
  if ((in_RDI != 0) && (in_ESI != 0)) {
    kVar5 = ktxHashList_Deserialize
                      ((ktxHashList *)0x0,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8);
    if ((kVar5 == KTX_SUCCESS) && (This != (ktxHashListEntry *)0x0)) {
      local_49 = 1;
      for (iVar10 = 0; This != (ktxHashListEntry *)0x0 && iVar10 < 100; iVar10 = iVar10 + 1) {
        ktxHashListEntry_GetKey(This,&local_64,&local_58);
        ktxHashListEntry_GetValue(This,&local_68,&local_60);
        if (local_60 == (uint *)0x0) {
          _Var4 = isKnownKeyValue(in_stack_ffffffffffffff68);
          if (!_Var4) {
            if ((local_49 & 1) == 0) {
              fprintf(_stdout,",%s",pcVar8);
            }
            local_49 = 0;
            printf("%*s\"%s\":%snull",(ulong)(uint)(in_EDX * in_ECX),"",local_58,pcVar7);
          }
        }
        else {
          iVar6 = strcmp(local_58,"KTXglFormat");
          if (iVar6 == 0) {
            if (local_68 == 0xc) {
              if ((local_49 & 1) == 0) {
                fprintf(_stdout,",%s",pcVar8);
              }
              local_49 = 0;
              in_stack_ffffffffffffff94 = *local_60;
              in_stack_ffffffffffffff90 = local_60[1];
              uVar1 = local_60[2];
              printf("%*s\"%s\":%s{%s",(ulong)(uint)(in_EDX * in_ECX),"",local_58,pcVar7,pcVar8);
              printf("%*s\"glInternalformat\":%s%u,%s",(ulong)(uint)((in_EDX + 1) * in_ECX),"",
                     pcVar7,(ulong)in_stack_ffffffffffffff94,pcVar8);
              printf("%*s\"glFormat\":%s%u,%s",(ulong)(uint)((in_EDX + 1) * in_ECX),"",pcVar7,
                     (ulong)in_stack_ffffffffffffff90,pcVar8);
              printf("%*s\"glType\":%s%u%s",(ulong)(uint)((in_EDX + 1) * in_ECX),"",pcVar7,
                     (ulong)uVar1,pcVar8);
              printf("%*s}",(ulong)(uint)(in_EDX * in_ECX),"");
            }
          }
          else {
            iVar6 = strcmp(local_58,"KTXanimData");
            if (iVar6 == 0) {
              if (local_68 == 0xc) {
                if ((local_49 & 1) == 0) {
                  fprintf(_stdout,",%s",pcVar8);
                }
                local_49 = 0;
                uVar1 = *local_60;
                uVar2 = local_60[1];
                uVar3 = local_60[2];
                printf("%*s\"%s\":%s{%s",(ulong)(uint)(in_EDX * in_ECX),"",local_58,pcVar7,pcVar8);
                printf("%*s\"duration\":%s%u,%s",(ulong)(uint)((in_EDX + 1) * in_ECX),"",pcVar7,
                       (ulong)uVar1,pcVar8);
                printf("%*s\"timescale\":%s%u,%s",(ulong)(uint)((in_EDX + 1) * in_ECX),"",pcVar7,
                       (ulong)uVar2,pcVar8);
                printf("%*s\"loopCount\":%s%u%s",(ulong)(uint)((in_EDX + 1) * in_ECX),"",pcVar7,
                       (ulong)uVar3,pcVar8);
                printf("%*s}",(ulong)(uint)(in_EDX * in_ECX),"");
              }
            }
            else {
              iVar6 = strcmp(local_58,"KTXcubemapIncomplete");
              if (iVar6 == 0) {
                if (local_68 == 1) {
                  if ((local_49 & 1) == 0) {
                    fprintf(_stdout,",%s",pcVar8);
                  }
                  local_49 = 0;
                  uVar1 = *local_60;
                  printf("%*s\"%s\":%s{%s",(ulong)(uint)(in_EDX * in_ECX),"",local_58,pcVar7,pcVar8)
                  ;
                  pcVar9 = "false";
                  if ((uVar1 & 1) != 0) {
                    pcVar9 = "true";
                  }
                  printf("%*s\"positiveX\":%s%s,%s",(ulong)(uint)((in_EDX + 1) * in_ECX),"",pcVar7,
                         pcVar9,pcVar8);
                  pcVar9 = "false";
                  if ((uVar1 & 2) != 0) {
                    pcVar9 = "true";
                  }
                  printf("%*s\"negativeX\":%s%s,%s",(ulong)(uint)((in_EDX + 1) * in_ECX),"",pcVar7,
                         pcVar9,pcVar8);
                  pcVar9 = "false";
                  if ((uVar1 & 4) != 0) {
                    pcVar9 = "true";
                  }
                  printf("%*s\"positiveY\":%s%s,%s",(ulong)(uint)((in_EDX + 1) * in_ECX),"",pcVar7,
                         pcVar9,pcVar8);
                  pcVar9 = "false";
                  if ((uVar1 & 8) != 0) {
                    pcVar9 = "true";
                  }
                  printf("%*s\"negativeY\":%s%s,%s",(ulong)(uint)((in_EDX + 1) * in_ECX),"",pcVar7,
                         pcVar9,pcVar8);
                  pcVar9 = "false";
                  if ((uVar1 & 0x10) != 0) {
                    pcVar9 = "true";
                  }
                  printf("%*s\"positiveZ\":%s%s,%s",(ulong)(uint)((in_EDX + 1) * in_ECX),"",pcVar7,
                         pcVar9,pcVar8);
                  pcVar9 = "false";
                  if ((uVar1 & 0x20) != 0) {
                    pcVar9 = "true";
                  }
                  printf("%*s\"negativeZ\":%s%s%s",(ulong)(uint)((in_EDX + 1) * in_ECX),"",pcVar7,
                         pcVar9,pcVar8);
                  printf("%*s}",(ulong)(uint)(in_EDX * in_ECX),"");
                }
              }
              else {
                _Var4 = isKnownKeyValueUINT32(in_stack_ffffffffffffff68);
                if (_Var4) {
                  if (local_68 == 4) {
                    if ((local_49 & 1) == 0) {
                      fprintf(_stdout,",%s",pcVar8);
                    }
                    local_49 = 0;
                    printf("%*s\"%s\":%s%u",(ulong)(uint)(in_EDX * in_ECX),"",local_58,pcVar7,
                           (ulong)*local_60);
                  }
                }
                else {
                  _Var4 = isKnownKeyValueString(in_stack_ffffffffffffff68);
                  if (_Var4) {
                    if (*(byte *)((long)local_60 + (ulong)(local_68 - 1)) == 0) {
                      if ((local_49 & 1) == 0) {
                        fprintf(_stdout,",%s",pcVar8);
                      }
                      local_49 = 0;
                      printf("%*s\"%s\":%s\"%s\"",(ulong)(uint)(in_EDX * in_ECX),"",local_58,pcVar7,
                             local_60);
                    }
                  }
                  else {
                    if ((local_49 & 1) == 0) {
                      fprintf(_stdout,",%s",pcVar8);
                    }
                    local_49 = 0;
                    printf("%*s\"%s\":%s[",(ulong)(uint)(in_EDX * in_ECX),"",local_58,pcVar7);
                    for (local_8c = 0; local_8c < local_68; local_8c = local_8c + 1) {
                      pcVar9 = ", ";
                      if (local_8c + 1 == local_68) {
                        pcVar9 = "";
                      }
                      fprintf(_stdout,"%d%s",
                              (ulong)(uint)(int)(char)*(byte *)((long)local_60 + (ulong)local_8c),
                              pcVar9);
                    }
                    fprintf(_stdout,"]");
                  }
                }
              }
            }
          }
        }
        This = ktxHashList_Next(This);
      }
      fprintf(_stdout,"%s",pcVar8);
      ktxHashList_Destruct
                ((ktxHashList *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    }
    return;
  }
  __assert_fail("pKvd != NULL && kvdLen > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/info.c"
                ,0xf2,
                "void printKVDataJSON(ktx_uint8_t *, ktx_uint32_t, ktx_uint32_t, ktx_uint32_t, _Bool)"
               );
}

Assistant:

void
printKVDataJSON(ktx_uint8_t* pKvd, ktx_uint32_t kvdLen, ktx_uint32_t base_indent, ktx_uint32_t indent_width, bool minified)
{
    const char* space = minified ? "" : " ";
    const char* nl = minified ? "" : "\n";

    KTX_error_code result;
    ktxHashList kvDataHead = 0;

    assert(pKvd != NULL && kvdLen > 0);

    result = ktxHashList_Deserialize(&kvDataHead, kvdLen, pKvd);
    if (result != KTX_SUCCESS) {
        // Logging while printing JSON is not possible, we rely on the validation step to provide meaningful errors
        // fprintf(stdout, "Failed to parse or not enough memory to build list of key/value pairs.\n");
        return;
    }

    if (kvDataHead == NULL)
        return;

    int entryIndex = 0;
    ktxHashListEntry* entry = kvDataHead;
    bool firstPrint = true; // Marks if the first print did not occur yet (first print != first entry)
    for (; entry != NULL && entryIndex < MAX_NUM_KVD_ENTRIES; entry = ktxHashList_Next(entry), ++entryIndex) {
        char* key;
        char* value;
        ktx_uint32_t keyLen, valueLen;

        ktxHashListEntry_GetKey(entry, &keyLen, &key);
        ktxHashListEntry_GetValue(entry, &valueLen, (void**)&value);
        // Keys must be NUL terminated.
        if (!value) {
            if (!isKnownKeyValue(key)) {
                // Known keys are not be printed with null
                if (!firstPrint)
                    fprintf(stdout, ",%s", nl);
                firstPrint = false;
                PRINT_INDENT(0, "\"%s\":%snull", key, space)
            }
        } else {
            if (strcmp(key, "KTXglFormat") == 0) {
                if (valueLen == 3 * sizeof(ktx_uint32_t)) {
                    if (!firstPrint)
                        fprintf(stdout, ",%s", nl);
                    firstPrint = false;
                    ktx_uint32_t glInternalformat = *(const ktx_uint32_t*) (value + 0);
                    ktx_uint32_t glFormat = *(const ktx_uint32_t*) (value + 4);
                    ktx_uint32_t glType = *(const ktx_uint32_t*) (value + 8);
                    PRINT_INDENT(0, "\"%s\":%s{%s", key, space, nl)
                    PRINT_INDENT(1, "\"glInternalformat\":%s%u,%s", space, glInternalformat, nl)
                    PRINT_INDENT(1, "\"glFormat\":%s%u,%s", space, glFormat, nl)
                    PRINT_INDENT(1, "\"glType\":%s%u%s", space, glType, nl)
                    PRINT_INDENT_NOARG(0, "}")
                }
            } else if (strcmp(key, "KTXanimData") == 0) {
                if (valueLen == 3 * sizeof(ktx_uint32_t)) {
                    if (!firstPrint)
                        fprintf(stdout, ",%s", nl);
                    firstPrint = false;
                    ktx_uint32_t duration = *(const ktx_uint32_t*) (value + 0);
                    ktx_uint32_t timescale = *(const ktx_uint32_t*) (value + 4);
                    ktx_uint32_t loopCount = *(const ktx_uint32_t*) (value + 8);
                    PRINT_INDENT(0, "\"%s\":%s{%s", key, space, nl)
                    PRINT_INDENT(1, "\"duration\":%s%u,%s", space, duration, nl)
                    PRINT_INDENT(1, "\"timescale\":%s%u,%s", space, timescale, nl)
                    PRINT_INDENT(1, "\"loopCount\":%s%u%s", space, loopCount, nl)
                    PRINT_INDENT_NOARG(0, "}")
                }
            } else if (strcmp(key, "KTXcubemapIncomplete") == 0) {
                if (valueLen == sizeof(ktx_uint8_t)) {
                    if (!firstPrint)
                        fprintf(stdout, ",%s", nl);
                    firstPrint = false;
                    ktx_uint8_t faces = *value;
                    PRINT_INDENT(0, "\"%s\":%s{%s", key, space, nl)
                    PRINT_INDENT(1, "\"positiveX\":%s%s,%s", space, faces & 1u << 0u ? "true" : "false", nl)
                    PRINT_INDENT(1, "\"negativeX\":%s%s,%s", space, faces & 1u << 1u ? "true" : "false", nl)
                    PRINT_INDENT(1, "\"positiveY\":%s%s,%s", space, faces & 1u << 2u ? "true" : "false", nl)
                    PRINT_INDENT(1, "\"negativeY\":%s%s,%s", space, faces & 1u << 3u ? "true" : "false", nl)
                    PRINT_INDENT(1, "\"positiveZ\":%s%s,%s", space, faces & 1u << 4u ? "true" : "false", nl)
                    PRINT_INDENT(1, "\"negativeZ\":%s%s%s", space, faces & 1u << 5u ? "true" : "false", nl)
                    PRINT_INDENT_NOARG(0, "}")
                }
            } else if (isKnownKeyValueUINT32(key)) {
                if (valueLen == sizeof(ktx_uint32_t)) {
                    if (!firstPrint)
                        fprintf(stdout, ",%s", nl);
                    firstPrint = false;
                    ktx_uint32_t number = *(const ktx_uint32_t*) value;
                    PRINT_INDENT(0, "\"%s\":%s%u", key, space, number)
                }
            } else if (isKnownKeyValueString(key)) {
                if (value[valueLen-1] == '\0') {
                    if (!firstPrint)
                        fprintf(stdout, ",%s", nl);
                    firstPrint = false;
                    PRINT_INDENT(0, "\"%s\":%s\"%s\"", key, space, value)
                }
            } else {
                if (!firstPrint)
                    fprintf(stdout, ",%s", nl);
                firstPrint = false;
                PRINT_INDENT(0, "\"%s\":%s[", key, space)
                for (ktx_uint32_t i = 0; i < valueLen; i++)
                    fprintf(stdout, "%d%s", (int) value[i], i + 1 == valueLen ? "" : ", ");
                fprintf(stdout, "]");
            }
        }
    }
    fprintf(stdout, "%s", nl);

    ktxHashList_Destruct(&kvDataHead);
}